

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O2

void ImGui_ImplOpenGL3_RenderDrawData(ImDrawData *draw_data)

{
  uint *puVar1;
  ImDrawList *pIVar2;
  ImDrawCmd *pIVar3;
  code *pcVar4;
  undefined1 auVar5 [16];
  GLenum GVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  ImGuiIO *pIVar11;
  undefined4 in_ECX;
  int iVar12;
  int cmd_i;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  GLuint vao_handle;
  GLenum last_blend_equation_alpha;
  GLenum last_blend_equation_rgb;
  GLenum last_blend_dst_alpha;
  GLenum last_blend_src_alpha;
  GLenum last_blend_dst_rgb;
  GLenum last_blend_src_rgb;
  GLint last_vertex_array;
  GLint last_array_buffer;
  GLint last_sampler;
  GLint last_texture;
  GLint last_program;
  GLenum last_active_texture;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  GLenum last_clip_origin;
  GLint last_polygon_mode [2];
  float local_78;
  undefined1 local_74 [16];
  float local_64;
  undefined1 local_60 [16];
  undefined8 local_50;
  undefined1 local_48 [16];
  
  pIVar11 = ImGui::GetIO();
  local_c8 = (float)(int)((pIVar11->DisplayFramebufferScale).x * (draw_data->DisplaySize).x);
  fStack_c4 = (float)(int)((pIVar11->DisplayFramebufferScale).y * (draw_data->DisplaySize).y);
  auVar23._0_4_ = -(uint)(0 < (int)local_c8);
  auVar23._4_4_ = -(uint)(0 < (int)local_c8);
  auVar23._8_4_ = -(uint)(0 < (int)fStack_c4);
  auVar23._12_4_ = -(uint)(0 < (int)fStack_c4);
  iVar12 = movmskpd(in_ECX,auVar23);
  if (iVar12 == 3) {
    fStack_c0 = 0.0;
    fStack_bc = 0.0;
    ImDrawData::ScaleClipRects(draw_data,&pIVar11->DisplayFramebufferScale);
    glGetIntegerv(0x84e0,&last_active_texture);
    (*__glewActiveTexture)(0x84c0);
    glGetIntegerv(0x8b8d,&last_program);
    glGetIntegerv(0x8069,&last_texture);
    glGetIntegerv(0x8919,&last_sampler);
    glGetIntegerv(0x8894,&last_array_buffer);
    glGetIntegerv(0x85b5,&last_vertex_array);
    glGetIntegerv(0xb40,last_polygon_mode);
    glGetIntegerv(0xba2,last_viewport);
    glGetIntegerv(0xc10,last_scissor_box);
    glGetIntegerv(0x80c9,&last_blend_src_rgb);
    glGetIntegerv(0x80c8,&last_blend_dst_rgb);
    glGetIntegerv(0x80cb,&last_blend_src_alpha);
    glGetIntegerv(0x80ca,&last_blend_dst_alpha);
    glGetIntegerv(0x8009,&last_blend_equation_rgb);
    glGetIntegerv(0x883d,&last_blend_equation_alpha);
    cVar7 = glIsEnabled(0xbe2);
    cVar8 = glIsEnabled(0xb44);
    cVar9 = glIsEnabled(0xb71);
    cVar10 = glIsEnabled(0xc11);
    last_clip_origin = 0;
    glGetIntegerv(0x935c,&last_clip_origin);
    GVar6 = last_clip_origin;
    glEnable(0xbe2);
    (*__glewBlendEquation)(0x8006);
    glBlendFunc(0x302,0x303);
    glDisable(0xb44);
    glDisable(0xb71);
    glEnable(0xc11);
    glPolygonMode(0x408);
    local_d8 = fStack_c4;
    lVar15 = 0;
    fStack_d4 = local_d8;
    fStack_d0 = local_d8;
    fStack_cc = local_d8;
    glViewport(0,0,local_c8,fStack_c4);
    local_74 = (undefined1  [16])0x0;
    local_60 = (undefined1  [16])0x0;
    local_50 = 0xbf800000;
    fVar17 = (draw_data->DisplayPos).x;
    fVar19 = (draw_data->DisplaySize).x + fVar17;
    fVar18 = (draw_data->DisplayPos).y;
    fVar20 = (draw_data->DisplaySize).y + fVar18;
    local_78 = 2.0 / (fVar19 - fVar17);
    local_64 = 2.0 / (fVar18 - fVar20);
    auVar22._0_4_ = fVar17 + fVar19;
    auVar22._4_4_ = fVar18 + fVar20;
    auVar22._8_8_ = 0;
    auVar5._4_4_ = fVar20 - fVar18;
    auVar5._0_4_ = fVar17 - fVar19;
    auVar5._8_8_ = 0;
    auVar23 = divps(auVar22,auVar5);
    local_48._0_8_ = auVar23._0_8_;
    local_48._8_8_ = 0x3f80000000000000;
    (*__glewUseProgram)(g_ShaderHandle);
    (*__glewUniform1i)(g_AttribLocationTex,0);
    (*__glewUniformMatrix4fv)(g_AttribLocationProjMtx,1,'\0',&local_78);
    (*__glewBindSampler)(0,0);
    vao_handle = 0;
    (*__glewGenVertexArrays)(1,&vao_handle);
    (*__glewBindVertexArray)(vao_handle);
    (*__glewBindBuffer)(0x8892,g_VboHandle);
    (*__glewEnableVertexAttribArray)(g_AttribLocationPosition);
    (*__glewEnableVertexAttribArray)(g_AttribLocationUV);
    (*__glewEnableVertexAttribArray)(g_AttribLocationColor);
    (*__glewVertexAttribPointer)(g_AttribLocationPosition,2,0x1406,'\0',0x14,(void *)0x0);
    (*__glewVertexAttribPointer)(g_AttribLocationUV,2,0x1406,'\0',0x14,(void *)0x8);
    (*__glewVertexAttribPointer)(g_AttribLocationColor,4,0x1401,'\x01',0x14,(void *)0x10);
    fVar17 = (draw_data->DisplayPos).x;
    fVar18 = (draw_data->DisplayPos).y;
    local_c8 = (float)(int)local_c8;
    fStack_c4 = (float)(int)fStack_c4;
    fStack_c0 = (float)(int)fStack_c0;
    fStack_bc = (float)(int)fStack_bc;
    local_d8 = (float)(int)local_d8;
    fStack_d4 = (float)(int)fStack_d4;
    fStack_d0 = (float)(int)fStack_d0;
    fStack_cc = (float)(int)fStack_cc;
    for (; lVar15 < draw_data->CmdListsCount; lVar15 = lVar15 + 1) {
      pIVar2 = draw_data->CmdLists[lVar15];
      (*__glewBindBuffer)(0x8892,g_VboHandle);
      (*__glewBufferData)(0x8892,(long)(pIVar2->VtxBuffer).Size * 0x14,(pIVar2->VtxBuffer).Data,
                          0x88e0);
      (*__glewBindBuffer)(0x8893,g_ElementsHandle);
      (*__glewBufferData)(0x8893,(long)(pIVar2->IdxBuffer).Size * 2,(pIVar2->IdxBuffer).Data,0x88e0)
      ;
      lVar14 = 0;
      lVar16 = 0;
      for (lVar13 = 0; lVar13 < (pIVar2->CmdBuffer).Size; lVar13 = lVar13 + 1) {
        pIVar3 = (pIVar2->CmdBuffer).Data;
        puVar1 = (uint *)((long)&pIVar3->ElemCount + lVar14);
        pcVar4 = *(code **)((long)&pIVar3->UserCallback + lVar14);
        if (pcVar4 == (code *)0x0) {
          fVar19 = *(float *)((long)&(pIVar3->ClipRect).x + lVar14) - fVar17;
          if ((((fVar19 < local_c8) &&
               (fVar20 = *(float *)((long)&(pIVar3->ClipRect).y + lVar14) - fVar18,
               fVar20 < local_d8)) &&
              (fVar21 = *(float *)((long)&(pIVar3->ClipRect).z + lVar14) - fVar17, 0.0 <= fVar21))
             && (fVar24 = *(float *)((long)&(pIVar3->ClipRect).w + lVar14) - fVar18, 0.0 <= fVar24))
          {
            if (GVar6 != 0x8ca2) {
              fVar25 = local_d8 - fVar24;
              fVar21 = fVar21 - fVar19;
              fVar24 = fVar24 - fVar20;
              fVar20 = fVar25;
            }
            glScissor((int)fVar19,(int)fVar20,(int)fVar21,(int)fVar24);
            glBindTexture(0xde1,*(undefined4 *)((long)&pIVar3->TextureId + lVar14));
            glDrawElements(4,*(undefined4 *)((long)&pIVar3->ElemCount + lVar14),0x1403,lVar16);
          }
        }
        else {
          (*pcVar4)(pIVar2,puVar1);
        }
        lVar16 = lVar16 + (ulong)*puVar1 * 2;
        lVar14 = lVar14 + 0x30;
      }
    }
    (*__glewDeleteVertexArrays)(1,&vao_handle);
    (*__glewUseProgram)(last_program);
    glBindTexture(0xde1,last_texture);
    (*__glewBindSampler)(0,last_sampler);
    (*__glewActiveTexture)(last_active_texture);
    (*__glewBindVertexArray)(last_vertex_array);
    (*__glewBindBuffer)(0x8892,last_array_buffer);
    (*__glewBlendEquationSeparate)(last_blend_equation_rgb,last_blend_equation_alpha);
    (*__glewBlendFuncSeparate)
              (last_blend_src_rgb,last_blend_dst_rgb,last_blend_src_alpha,last_blend_dst_alpha);
    if (cVar7 == '\0') {
      glDisable(0xbe2);
    }
    else {
      glEnable(0xbe2);
    }
    if (cVar8 == '\0') {
      glDisable(0xb44);
    }
    else {
      glEnable(0xb44);
    }
    if (cVar9 == '\0') {
      glDisable(0xb71);
    }
    else {
      glEnable(0xb71);
    }
    if (cVar10 == '\0') {
      glDisable(0xc11);
    }
    else {
      glEnable(0xc11);
    }
    glPolygonMode(0x408,last_polygon_mode[0]);
    glViewport(last_viewport[0],last_viewport[1],last_viewport[2],last_viewport[3]);
    glScissor(last_scissor_box[0],last_scissor_box[1],last_scissor_box[2],last_scissor_box[3]);
  }
  return;
}

Assistant:

void    ImGui_ImplOpenGL3_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    ImGuiIO& io = ImGui::GetIO();
    int fb_width = (int)(draw_data->DisplaySize.x * io.DisplayFramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * io.DisplayFramebufferScale.y);
    if (fb_width <= 0 || fb_height <= 0)
        return;
    draw_data->ScaleClipRects(io.DisplayFramebufferScale);

    // Backup GL state
    GLenum last_active_texture; glGetIntegerv(GL_ACTIVE_TEXTURE, (GLint*)&last_active_texture);
    glActiveTexture(GL_TEXTURE0);
    GLint last_program; glGetIntegerv(GL_CURRENT_PROGRAM, &last_program);
    GLint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
#ifdef GL_SAMPLER_BINDING
    GLint last_sampler; glGetIntegerv(GL_SAMPLER_BINDING, &last_sampler);
#endif
    GLint last_array_buffer; glGetIntegerv(GL_ARRAY_BUFFER_BINDING, &last_array_buffer);
    GLint last_vertex_array; glGetIntegerv(GL_VERTEX_ARRAY_BINDING, &last_vertex_array);
#ifdef GL_POLYGON_MODE
    GLint last_polygon_mode[2]; glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
#endif
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLenum last_blend_src_rgb; glGetIntegerv(GL_BLEND_SRC_RGB, (GLint*)&last_blend_src_rgb);
    GLenum last_blend_dst_rgb; glGetIntegerv(GL_BLEND_DST_RGB, (GLint*)&last_blend_dst_rgb);
    GLenum last_blend_src_alpha; glGetIntegerv(GL_BLEND_SRC_ALPHA, (GLint*)&last_blend_src_alpha);
    GLenum last_blend_dst_alpha; glGetIntegerv(GL_BLEND_DST_ALPHA, (GLint*)&last_blend_dst_alpha);
    GLenum last_blend_equation_rgb; glGetIntegerv(GL_BLEND_EQUATION_RGB, (GLint*)&last_blend_equation_rgb);
    GLenum last_blend_equation_alpha; glGetIntegerv(GL_BLEND_EQUATION_ALPHA, (GLint*)&last_blend_equation_alpha);
    GLboolean last_enable_blend = glIsEnabled(GL_BLEND);
    GLboolean last_enable_cull_face = glIsEnabled(GL_CULL_FACE);
    GLboolean last_enable_depth_test = glIsEnabled(GL_DEPTH_TEST);
    GLboolean last_enable_scissor_test = glIsEnabled(GL_SCISSOR_TEST);
    bool clip_origin_lower_left = true;
#ifdef GL_CLIP_ORIGIN
    GLenum last_clip_origin = 0; glGetIntegerv(GL_CLIP_ORIGIN, (GLint*)&last_clip_origin); // Support for GL 4.5's glClipControl(GL_UPPER_LEFT)
    if (last_clip_origin == GL_UPPER_LEFT)
        clip_origin_lower_left = false;
#endif

    // Setup render state: alpha-blending enabled, no face culling, no depth testing, scissor enabled, polygon fill
    glEnable(GL_BLEND);
    glBlendEquation(GL_FUNC_ADD);
    glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
    glDisable(GL_CULL_FACE);
    glDisable(GL_DEPTH_TEST);
    glEnable(GL_SCISSOR_TEST);
#ifdef GL_POLYGON_MODE
    glPolygonMode(GL_FRONT_AND_BACK, GL_FILL);
#endif

    // Setup viewport, orthographic projection matrix
    // Our visible imgui space lies from draw_data->DisplayPos (top left) to draw_data->DisplayPos+data_data->DisplaySize (bottom right). DisplayMin is typically (0,0) for single viewport apps.
    glViewport(0, 0, (GLsizei)fb_width, (GLsizei)fb_height);
    float L = draw_data->DisplayPos.x;
    float R = draw_data->DisplayPos.x + draw_data->DisplaySize.x;
    float T = draw_data->DisplayPos.y;
    float B = draw_data->DisplayPos.y + draw_data->DisplaySize.y;
    const float ortho_projection[4][4] =
    {
        { 2.0f/(R-L),   0.0f,         0.0f,   0.0f },
        { 0.0f,         2.0f/(T-B),   0.0f,   0.0f },
        { 0.0f,         0.0f,        -1.0f,   0.0f },
        { (R+L)/(L-R),  (T+B)/(B-T),  0.0f,   1.0f },
    };
    glUseProgram(g_ShaderHandle);
    glUniform1i(g_AttribLocationTex, 0);
    glUniformMatrix4fv(g_AttribLocationProjMtx, 1, GL_FALSE, &ortho_projection[0][0]);
#ifdef GL_SAMPLER_BINDING
    glBindSampler(0, 0); // We use combined texture/sampler state. Applications using GL 3.3 may set that otherwise.
#endif
    // Recreate the VAO every time
    // (This is to easily allow multiple GL contexts. VAO are not shared among GL contexts, and we don't track creation/deletion of windows so we don't have an obvious key to use to cache them.)
    GLuint vao_handle = 0;
    glGenVertexArrays(1, &vao_handle);
    glBindVertexArray(vao_handle);
    glBindBuffer(GL_ARRAY_BUFFER, g_VboHandle);
    glEnableVertexAttribArray(g_AttribLocationPosition);
    glEnableVertexAttribArray(g_AttribLocationUV);
    glEnableVertexAttribArray(g_AttribLocationColor);
    glVertexAttribPointer(g_AttribLocationPosition, 2, GL_FLOAT, GL_FALSE, sizeof(ImDrawVert), (GLvoid*)IM_OFFSETOF(ImDrawVert, pos));
    glVertexAttribPointer(g_AttribLocationUV, 2, GL_FLOAT, GL_FALSE, sizeof(ImDrawVert), (GLvoid*)IM_OFFSETOF(ImDrawVert, uv));
    glVertexAttribPointer(g_AttribLocationColor, 4, GL_UNSIGNED_BYTE, GL_TRUE, sizeof(ImDrawVert), (GLvoid*)IM_OFFSETOF(ImDrawVert, col));

    // Draw
    ImVec2 pos = draw_data->DisplayPos;
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];
        const ImDrawIdx* idx_buffer_offset = 0;

        glBindBuffer(GL_ARRAY_BUFFER, g_VboHandle);
        glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)cmd_list->VtxBuffer.Size * sizeof(ImDrawVert), (const GLvoid*)cmd_list->VtxBuffer.Data, GL_STREAM_DRAW);

        glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, g_ElementsHandle);
        glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)cmd_list->IdxBuffer.Size * sizeof(ImDrawIdx), (const GLvoid*)cmd_list->IdxBuffer.Data, GL_STREAM_DRAW);

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback)
            {
                // User callback (registered via ImDrawList::AddCallback)
                pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                ImVec4 clip_rect = ImVec4(pcmd->ClipRect.x - pos.x, pcmd->ClipRect.y - pos.y, pcmd->ClipRect.z - pos.x, pcmd->ClipRect.w - pos.y);
                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f && clip_rect.w >= 0.0f)
                {
                    // Apply scissor/clipping rectangle
                    if (clip_origin_lower_left)
                        glScissor((int)clip_rect.x, (int)(fb_height - clip_rect.w), (int)(clip_rect.z - clip_rect.x), (int)(clip_rect.w - clip_rect.y));
                    else
                        glScissor((int)clip_rect.x, (int)clip_rect.y, (int)clip_rect.z, (int)clip_rect.w); // Support for GL 4.5's glClipControl(GL_UPPER_LEFT)

                    // Bind texture, Draw
                    glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->TextureId);
                    glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, idx_buffer_offset);
                }
            }
            idx_buffer_offset += pcmd->ElemCount;
        }
    }
    glDeleteVertexArrays(1, &vao_handle);

    // Restore modified GL state
    glUseProgram(last_program);
    glBindTexture(GL_TEXTURE_2D, last_texture);
#ifdef GL_SAMPLER_BINDING
    glBindSampler(0, last_sampler);
#endif
    glActiveTexture(last_active_texture);
    glBindVertexArray(last_vertex_array);
    glBindBuffer(GL_ARRAY_BUFFER, last_array_buffer);
    glBlendEquationSeparate(last_blend_equation_rgb, last_blend_equation_alpha);
    glBlendFuncSeparate(last_blend_src_rgb, last_blend_dst_rgb, last_blend_src_alpha, last_blend_dst_alpha);
    if (last_enable_blend) glEnable(GL_BLEND); else glDisable(GL_BLEND);
    if (last_enable_cull_face) glEnable(GL_CULL_FACE); else glDisable(GL_CULL_FACE);
    if (last_enable_depth_test) glEnable(GL_DEPTH_TEST); else glDisable(GL_DEPTH_TEST);
    if (last_enable_scissor_test) glEnable(GL_SCISSOR_TEST); else glDisable(GL_SCISSOR_TEST);
#ifdef GL_POLYGON_MODE
    glPolygonMode(GL_FRONT_AND_BACK, (GLenum)last_polygon_mode[0]);
#endif
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
}